

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::normal3d>
          (Attribute *this,double t,normal3d *dst,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type *pvVar2;
  optional<tinyusdz::value::normal3d> local_78;
  undefined1 local_58 [8];
  optional<tinyusdz::value::normal3d> v;
  TimeSampleInterpolationType tinterp_local;
  normal3d *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (normal3d *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&v.contained + 0x10),t);
    bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&v.contained + 0x10));
    if ((bVar1) && (bVar1 = has_value(this), bVar1)) {
      primvar::PrimVar::get_value<tinyusdz::value::normal3d>(&local_78,&this->_var);
      nonstd::optional_lite::optional<tinyusdz::value::normal3d>::
      optional<tinyusdz::value::normal3d,_0>
                ((optional<tinyusdz::value::normal3d> *)local_58,&local_78);
      nonstd::optional_lite::optional<tinyusdz::value::normal3d>::~optional(&local_78);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_58);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::normal3d>::value
                           ((optional<tinyusdz::value::normal3d> *)local_58);
        dst->x = pvVar2->x;
        dst->y = pvVar2->y;
        dst->z = pvVar2->z;
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<tinyusdz::value::normal3d>::~optional
                ((optional<tinyusdz::value::normal3d> *)local_58);
      if (bVar1) goto LAB_002e814e;
    }
    bVar1 = has_timesamples(this);
    if (bVar1) {
      this_local._7_1_ =
           primvar::PrimVar::get_interpolated_value<tinyusdz::value::normal3d>
                     (&this->_var,t,tinterp,dst);
    }
    else {
      this_local._7_1_ = get_value<tinyusdz::value::normal3d>(this,dst);
    }
  }
LAB_002e814e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }